

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterset.cpp
# Opt level: O0

void __thiscall ParameterSet::addParameter(ParameterSet *this,string *_name,int _defaultValue)

{
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Type>_>::value,_pair<iterator,_bool>_>
  _Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_98;
  _Base_ptr local_70;
  undefined1 local_68;
  Type local_4c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>
  local_48;
  int local_1c;
  string *psStack_18;
  int _defaultValue_local;
  string *_name_local;
  ParameterSet *this_local;
  
  local_4c = INT;
  local_1c = _defaultValue;
  psStack_18 = _name;
  _name_local = &this->name_;
  std::make_pair<std::__cxx11::string_const&,Type>(&local_48,_name,&local_4c);
  _Var1 = std::
          map<std::__cxx11::string,Type,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
          ::insert<std::pair<std::__cxx11::string,Type>>
                    ((map<std::__cxx11::string,Type,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type>>>
                      *)&this->type_dict,&local_48);
  local_70 = (_Base_ptr)_Var1.first._M_node;
  local_68 = _Var1.second;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type>::
  ~pair(&local_48);
  std::make_pair<std::__cxx11::string_const&,int&>(&local_98,psStack_18,&local_1c);
  std::
  map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::insert<std::pair<std::__cxx11::string,int>>
            ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)&this->int_dict,&local_98);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_98);
  return;
}

Assistant:

void ParameterSet::addParameter(const string &_name, int _defaultValue)
{
    type_dict.insert(std::make_pair(_name, INT));
    int_dict.insert(std::make_pair(_name, _defaultValue));
}